

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O0

void vera::extractMesh(Model *_model,Mesh *_mesh,mat4 _matrix,Scene *_scene,bool _verbose)

{
  int iVar1;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar2;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 v_pos;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 v_pos_00;
  bool bVar3;
  DrawMode DVar4;
  uint32_t byteStride_00;
  int iVar5;
  ostream *poVar6;
  Primitive *pPVar7;
  size_type sVar8;
  void *pvVar9;
  const_reference pvVar10;
  reference ppVar11;
  const_reference bufferViewObject;
  const_reference pvVar12;
  const_reference pvVar13;
  float *pfVar14;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *pvVar15;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  *this;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar16;
  const_reference _material;
  Material *pMVar17;
  Model *this_01;
  mapped_type *ppMVar18;
  mat<3,_3,_float,_(glm::qualifier)0> *m;
  mat<3,_3,_float,_(glm::qualifier)0> *m_00;
  col_type cVar19;
  vec<3,_float,_(glm::qualifier)0> vVar20;
  col_type cVar21;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_2c8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_2c4;
  Material *mat;
  vec4 tan;
  size_t v_4;
  vec2 uv;
  size_t v_3;
  vec<3,_float,_(glm::qualifier)0> local_218;
  vec3 local_208;
  undefined1 local_1fc [8];
  vec3 nor;
  size_t v_2;
  vec4 col;
  size_t v_1;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_1c8;
  undefined8 local_1c4;
  vec3 local_1bc;
  undefined1 local_1b0 [8];
  vec4 pos;
  size_t v;
  int byteStride;
  Buffer *buffer;
  BufferView *bufferView;
  Accessor *accessor;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *attrib;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2;
  undefined1 local_148 [8];
  Mesh mesh;
  Primitive *primitive;
  size_t i;
  mat<3,_3,_float,_(glm::qualifier)0> local_6c;
  undefined1 local_48 [8];
  mat3 normalMatrix;
  bool _verbose_local;
  Scene *_scene_local;
  Mesh *_mesh_local;
  Model *_model_local;
  
  normalMatrix.value[2].field_1._3_1_ = _verbose;
  unique0x10001251 = _scene;
  if (_verbose) {
    poVar6 = std::operator<<((ostream *)&std::cout,"  Parsing Mesh ");
    poVar6 = std::operator<<(poVar6,(string *)_mesh);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  glm::mat<3,_3,_float,_(glm::qualifier)0>::mat((mat<3,_3,_float,_(glm::qualifier)0> *)&i,&_matrix);
  glm::inverse<3,3,float,(glm::qualifier)0>(&local_6c,(glm *)&i,m);
  glm::transpose<3,3,float,(glm::qualifier)0>((transpose_type *)local_48,(glm *)&local_6c,m_00);
  for (primitive = (Primitive *)0x0;
      pPVar7 = (Primitive *)
               std::vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>::size
                         (&_mesh->primitives), primitive < pPVar7;
      primitive = (Primitive *)&(primitive->attributes)._M_t._M_impl.field_0x1) {
    if ((normalMatrix.value[2].field_1._3_1_ & 1) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"   primitive ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(ulong)&(primitive->attributes)._M_t._M_impl.field_0x1);
      poVar6 = std::operator<<(poVar6,"/");
      sVar8 = std::vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>::size
                        (&_mesh->primitives);
      pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    mesh.m_material =
         (Material *)
         std::vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>::operator[]
                   (&_mesh->primitives,(size_type)primitive);
    Mesh::Mesh((Mesh *)local_148);
    if (-1 < *(int *)((long)&((mesh.m_material)->super_HaveDefines).m_defines._M_t._M_impl.
                             super__Rb_tree_header._M_node_count + 4)) {
      pvVar10 = std::vector<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>::operator[]
                          (&_model->accessors,
                           (long)*(int *)((long)&((mesh.m_material)->super_HaveDefines).m_defines.
                                                 _M_t._M_impl.super__Rb_tree_header._M_node_count +
                                         4));
      extractIndices(_model,pvVar10,(Mesh *)local_148);
    }
    DVar4 = extractMode((Primitive *)mesh.m_material);
    Mesh::setDrawMode((Mesh *)local_148,DVar4);
    pMVar17 = mesh.m_material;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)mesh.m_material);
    attrib = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)pMVar17);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&attrib), bVar3) {
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                ::operator*(&__end2);
      pvVar10 = std::vector<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>::operator[]
                          (&_model->accessors,(long)ppVar11->second);
      bufferViewObject =
           std::vector<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>::operator[]
                     (&_model->bufferViews,(long)pvVar10->bufferView);
      pvVar12 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                          (&_model->buffers,(long)bufferViewObject->buffer);
      byteStride_00 = tinygltf::Accessor::ByteStride(pvVar10,bufferViewObject);
      iVar5 = std::__cxx11::string::compare((char *)ppVar11);
      if (iVar5 == 0) {
        pos.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
        pos.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
        for (; (ulong)pos._8_8_ < pvVar10->count; pos._8_8_ = pos._8_8_ + 1) {
          glm::vec<4,_float,_(glm::qualifier)0>::vec
                    ((vec<4,_float,_(glm::qualifier)0> *)local_1b0,1.0);
          aVar2 = pos.field_2;
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&pvVar12->data,bufferViewObject->byteOffset + pvVar10->byteOffset);
          iVar5 = pvVar10->componentType;
          iVar1 = pvVar10->type;
          bVar3 = pvVar10->normalized;
          pfVar14 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                              ((vec<4,_float,_(glm::qualifier)0> *)local_1b0,0);
          extractVertexData((uint32_t)aVar2,pvVar13,iVar5,iVar1,(bool)(bVar3 & 1),byteStride_00,
                            pfVar14,'\x03');
          cVar21 = glm::operator*(&_matrix,(row_type *)local_1b0);
          local_1c4 = cVar21._8_8_;
          local_2c8 = cVar21.field_0;
          aStack_2c4 = cVar21.field_1;
          v_1._4_4_ = local_2c8;
          aStack_1c8 = aStack_2c4;
          glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
                    ((vec<3,float,(glm::qualifier)0> *)&local_1bc,
                     (vec<4,_float,_(glm::qualifier)0> *)((long)&v_1 + 4));
          Mesh::addVertex((Mesh *)local_148,&local_1bc);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)ppVar11);
        if (iVar5 == 0) {
          col.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
          col.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
          for (; (ulong)col._8_8_ < pvVar10->count; col._8_8_ = col._8_8_ + 1) {
            glm::vec<4,_float,_(glm::qualifier)0>::vec((vec<4,_float,_(glm::qualifier)0> *)&v_2,1.0)
            ;
            aVar2 = col.field_2;
            pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (&pvVar12->data,bufferViewObject->byteOffset + pvVar10->byteOffset);
            iVar5 = pvVar10->componentType;
            iVar1 = pvVar10->type;
            bVar3 = pvVar10->normalized;
            pfVar14 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                                ((vec<4,_float,_(glm::qualifier)0> *)&v_2,0);
            extractVertexData((uint32_t)aVar2,pvVar13,iVar5,iVar1,(bool)(bVar3 & 1),byteStride_00,
                              pfVar14,'\x04');
            Mesh::addColor((Mesh *)local_148,(vec4 *)&v_2);
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)ppVar11);
          if (iVar5 == 0) {
            nor.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
            nor.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
            for (; (ulong)nor._4_8_ < pvVar10->count; nor._4_8_ = nor._4_8_ + 1) {
              v_pos_00 = nor.field_1;
              pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  (&pvVar12->data,bufferViewObject->byteOffset + pvVar10->byteOffset
                                  );
              iVar5 = pvVar10->componentType;
              iVar1 = pvVar10->type;
              bVar3 = pvVar10->normalized;
              pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                                  ((vec<3,_float,_(glm::qualifier)0> *)local_1fc,0);
              extractVertexData((uint32_t)v_pos_00,pvVar13,iVar5,iVar1,(bool)(bVar3 & 1),
                                byteStride_00,pfVar14,'\x03');
              cVar19 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)local_48,
                                      (row_type *)local_1fc);
              local_218.field_2 = cVar19.field_2;
              local_218._0_8_ = cVar19._0_8_;
              vVar20 = glm::normalize<3,float,(glm::qualifier)0>(&local_218);
              local_208.field_2 = vVar20.field_2;
              local_208._0_8_ = vVar20._0_8_;
              Mesh::addNormal((Mesh *)local_148,&local_208);
            }
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)ppVar11);
            if (iVar5 == 0) {
              uv.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
              uv.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
              for (; (ulong)uv < pvVar10->count; uv = (vec2)((long)uv + 1)) {
                v_pos = uv.field_0;
                pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&pvVar12->data,
                                     bufferViewObject->byteOffset + pvVar10->byteOffset);
                iVar5 = pvVar10->componentType;
                iVar1 = pvVar10->type;
                bVar3 = pvVar10->normalized;
                pfVar14 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                                    ((vec<2,_float,_(glm::qualifier)0> *)&v_4,0);
                extractVertexData((uint32_t)v_pos,pvVar13,iVar5,iVar1,(bool)(bVar3 & 1),
                                  byteStride_00,pfVar14,'\x02');
                Mesh::addTexCoord((Mesh *)local_148,(vec2 *)&v_4);
              }
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)ppVar11);
              if (iVar5 == 0) {
                tan.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
                tan.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
                for (; (ulong)tan._8_8_ < pvVar10->count; tan._8_8_ = tan._8_8_ + 1) {
                  aVar2 = tan.field_2;
                  pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      (&pvVar12->data,
                                       bufferViewObject->byteOffset + pvVar10->byteOffset);
                  iVar5 = pvVar10->componentType;
                  iVar1 = pvVar10->type;
                  bVar3 = pvVar10->normalized;
                  pfVar14 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                                      ((vec<4,_float,_(glm::qualifier)0> *)&mat,0);
                  extractVertexData((uint32_t)aVar2,pvVar13,iVar5,iVar1,(bool)(bVar3 & 1),
                                    byteStride_00,pfVar14,'\x04');
                  Mesh::addTangent((Mesh *)local_148,(vec4 *)&mat);
                }
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cout," ");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"Attribute: ");
                poVar6 = std::operator<<(poVar6,(string *)ppVar11);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"  type        :");
                pvVar9 = (void *)std::ostream::operator<<(poVar6,pvVar10->type);
                std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"  component   :");
                pvVar9 = (void *)std::ostream::operator<<(poVar6,pvVar10->componentType);
                std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"  normalize   :");
                pvVar9 = (void *)std::ostream::operator<<(poVar6,(bool)(pvVar10->normalized & 1));
                std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"  bufferView  :");
                pvVar9 = (void *)std::ostream::operator<<(poVar6,pvVar10->bufferView);
                std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"  byteOffset  :");
                pvVar9 = (void *)std::ostream::operator<<(poVar6,pvVar10->byteOffset);
                std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"  count       :");
                pvVar9 = (void *)std::ostream::operator<<(poVar6,pvVar10->count);
                std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout,"  byteStride  :");
                pvVar9 = (void *)std::ostream::operator<<(poVar6,byteStride_00);
                std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<((ostream *)&std::cout," ");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              }
            }
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++(&__end2);
    }
    if ((normalMatrix.value[2].field_1._3_1_ & 1) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"    vertices = ");
      pvVar15 = Mesh::getVertices((Mesh *)local_148);
      sVar8 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::size(pvVar15);
      pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"    colors   = ");
      this = Mesh::getColors((Mesh *)local_148);
      sVar8 = std::
              vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
              ::size(this);
      pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"    normals  = ");
      pvVar15 = Mesh::getNormals((Mesh *)local_148);
      sVar8 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::size(pvVar15);
      pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"    uvs      = ");
      this_00 = Mesh::getTexCoords((Mesh *)local_148);
      sVar8 = std::
              vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ::size(this_00);
      pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"    indices  = ");
      pvVar16 = Mesh::getIndices((Mesh *)local_148);
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar16);
      pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      DVar4 = Mesh::getDrawMode((Mesh *)local_148);
      if (DVar4 == TRIANGLES) {
        poVar6 = std::operator<<((ostream *)&std::cout,"    triang.  = ");
        pvVar16 = Mesh::getIndices((Mesh *)local_148);
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar16);
        pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8 / 3);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      }
      else {
        DVar4 = Mesh::getDrawMode((Mesh *)local_148);
        if (DVar4 == LINES) {
          poVar6 = std::operator<<((ostream *)&std::cout,"    lines    = ");
          pvVar16 = Mesh::getIndices((Mesh *)local_148);
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar16);
          pvVar9 = (void *)std::ostream::operator<<(poVar6,sVar8 >> 1);
          std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    bVar3 = Mesh::haveNormals((Mesh *)local_148);
    if (((!bVar3) && (bVar3 = Mesh::computeNormals((Mesh *)local_148), bVar3)) &&
       ((normalMatrix.value[2].field_1._3_1_ & 1) != 0)) {
      poVar6 = std::operator<<((ostream *)&std::cout,"    . Compute normals");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    bVar3 = Mesh::computeTangents((Mesh *)local_148);
    if ((bVar3) && ((normalMatrix.value[2].field_1._3_1_ & 1) != 0)) {
      poVar6 = std::operator<<((ostream *)&std::cout,"    . Compute tangents");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    _material = std::vector<tinygltf::Material,_std::allocator<tinygltf::Material>_>::operator[]
                          (&_model->materials,
                           (long)(int)((mesh.m_material)->super_HaveDefines).m_defines._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
    pMVar17 = extractMaterial(_model,_material,stack0xffffffffffffffe0,
                              (bool)(normalMatrix.value[2].field_1._3_1_ & 1));
    this_01 = (Model *)operator_new(0x2d8);
    Model::Model(this_01,&_mesh->name,(Mesh *)local_148,pMVar17);
    ppMVar18 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
               ::operator[](&stack0xffffffffffffffe0->models,&_mesh->name);
    *ppMVar18 = this_01;
    Mesh::~Mesh((Mesh *)local_148);
  }
  return;
}

Assistant:

void extractMesh(const tinygltf::Model& _model, const tinygltf::Mesh& _mesh, glm::mat4 _matrix, Scene* _scene, bool _verbose) {
    if (_verbose)
        std::cout << "  Parsing Mesh " << _mesh.name << std::endl;

    glm::mat3 normalMatrix = glm::transpose(glm::inverse(glm::mat3(_matrix)));

    for (size_t i = 0; i < _mesh.primitives.size(); ++i) {
        if (_verbose)
            std::cout << "   primitive " << i + 1 << "/" << _mesh.primitives.size() << std::endl;

        const tinygltf::Primitive &primitive = _mesh.primitives[i];

        Mesh mesh;
        if (primitive.indices >= 0)
            extractIndices(_model, _model.accessors[primitive.indices], mesh);
        mesh.setDrawMode(extractMode(primitive));

        // Extract Vertex Data
        for (auto &attrib : primitive.attributes) {
            const tinygltf::Accessor &accessor = _model.accessors[attrib.second];
            const tinygltf::BufferView &bufferView = _model.bufferViews[accessor.bufferView];
            const tinygltf::Buffer &buffer = _model.buffers[bufferView.buffer];
            int byteStride = accessor.ByteStride(bufferView);

            if (attrib.first.compare("POSITION") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 pos = glm::vec4(1.0);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &pos[0], 3);
                    mesh.addVertex( glm::vec3(_matrix * pos) );
                }
            }

            else if (attrib.first.compare("COLOR_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 col = glm::vec4(1.0f);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &col[0], 4);
                    mesh.addColor(col);
                }
            }

            else if (attrib.first.compare("NORMAL") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec3 nor;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &nor[0], 3);
                    mesh.addNormal( normalize(normalMatrix * nor) );
                }
            }

            else if (attrib.first.compare("TEXCOORD_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec2 uv;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &uv[0], 2);
                    mesh.addTexCoord(uv);
                }
            }

            else if (attrib.first.compare("TANGENT") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 tan;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &tan[0], 4);
                    mesh.addTangent(tan);
                }
            }

            else {
                std::cout << " " << std::endl;
                std::cout << "Attribute: " << attrib.first << std::endl;
                std::cout << "  type        :" << accessor.type << std::endl;
                std::cout << "  component   :" << accessor.componentType << std::endl;
                std::cout << "  normalize   :" << accessor.normalized << std::endl;
                std::cout << "  bufferView  :" << accessor.bufferView << std::endl;
                std::cout << "  byteOffset  :" << accessor.byteOffset << std::endl;
                std::cout << "  count       :" << accessor.count << std::endl;
                std::cout << "  byteStride  :" << byteStride << std::endl;
                std::cout << " "<< std::endl;
            }
        }

        if (_verbose) {
            std::cout << "    vertices = " << mesh.getVertices().size() << std::endl;
            std::cout << "    colors   = " << mesh.getColors().size() << std::endl;
            std::cout << "    normals  = " << mesh.getNormals().size() << std::endl;
            std::cout << "    uvs      = " << mesh.getTexCoords().size() << std::endl;
            std::cout << "    indices  = " << mesh.getIndices().size() << std::endl;

            if (mesh.getDrawMode() == GL_TRIANGLES) {
                std::cout << "    triang.  = " << mesh.getIndices().size()/3 << std::endl;
            }
            else if (mesh.getDrawMode() == GL_LINES ) {
                std::cout << "    lines    = " << mesh.getIndices().size()/2 << std::endl;
            }
        }

        if ( !mesh.haveNormals() )
            if ( mesh.computeNormals() )
                if ( _verbose )
                    std::cout << "    . Compute normals" << std::endl;

        if ( mesh.computeTangents() )
            if ( _verbose )
                std::cout << "    . Compute tangents" << std::endl;

        Material* mat = extractMaterial( _model, _model.materials[primitive.material], _scene, _verbose );
        _scene->models[_mesh.name] = new Model(_mesh.name, mesh, mat);
    }
}